

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

MPP_RET vdpp2_wait(vdpp2_api_ctx *ctx)

{
  uint __errnum;
  MPP_RET MVar1;
  MPP_RET extraout_EAX;
  uint *puVar2;
  char *pcVar3;
  MppReqV1 mpp_req;
  
  MVar1 = ioctl(ctx->fd,0x40047601);
  if (MVar1 != MPP_OK) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    _mpp_log_l(2,"vdpp2","ioctl POLL_HW_FINISH failed ret %d errno %d %s\n","vdpp2_wait",
               (ulong)(uint)MVar1,(ulong)__errnum,pcVar3);
    MVar1 = extraout_EAX;
  }
  return MVar1;
}

Assistant:

static MPP_RET vdpp2_wait(struct vdpp2_api_ctx *ctx)
{
    MPP_RET ret;
    MppReqV1 mpp_req;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    memset(&mpp_req, 0, sizeof(mpp_req));
    mpp_req.cmd = MPP_CMD_POLL_HW_FINISH;
    mpp_req.flag |= MPP_FLAGS_LAST_MSG;

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err_f("ioctl POLL_HW_FINISH failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
    }

    return ret;
}